

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexExpanderShader::shadePrimitives
          (VertexExpanderShader *this,GeometryEmitter *output,int verticesIn,
          PrimitivePacket *packets,int numPackets,int invocationID)

{
  GenericVec4 *varyings;
  VertexPacket *pVVar1;
  PrimitivePacket *pPVar2;
  ulong uVar3;
  Vector<float,_4> res;
  ulong local_88;
  Vec4 local_78;
  ulong local_68;
  ulong local_60;
  VertexPacket **local_58;
  PrimitivePacket *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (0 < numPackets) {
    local_68 = (ulong)(uint)numPackets;
    local_60 = (ulong)(uint)verticesIn;
    local_58 = packets->vertices;
    local_88 = 0;
    do {
      if (0 < verticesIn) {
        local_50 = packets + local_88;
        uVar3 = 0;
        do {
          pPVar2 = local_50;
          fStack_3c = (float)local_50->primitiveIDIn;
          local_48 = fStack_3c * 0.02;
          fStack_44 = fStack_3c * 0.1;
          fStack_40 = fStack_3c * 0.0;
          fStack_3c = fStack_3c * 0.0;
          pVVar1 = local_58[uVar3];
          local_78.m_data[0] = (pVVar1->position).m_data[0] + -0.07 + local_48;
          local_78.m_data[1] = (pVVar1->position).m_data[1] + -0.01 + fStack_44;
          local_78.m_data[2] = (pVVar1->position).m_data[2] + 0.0 + fStack_40;
          local_78.m_data[3] = (pVVar1->position).m_data[3] + 0.0 + fStack_3c;
          varyings = pVVar1->outputs;
          rr::GeometryEmitter::EmitVertex
                    (output,&local_78,pVVar1->pointSize,varyings,local_50->primitiveIDIn);
          local_78.m_data[0] = (pVVar1->position).m_data[0] + 0.03 + local_48;
          local_78.m_data[1] = (pVVar1->position).m_data[1] + -0.03 + fStack_44;
          local_78.m_data[2] = (pVVar1->position).m_data[2] + 0.0 + fStack_40;
          local_78.m_data[3] = (pVVar1->position).m_data[3] + 0.0 + fStack_3c;
          rr::GeometryEmitter::EmitVertex
                    (output,&local_78,pVVar1->pointSize,varyings,pPVar2->primitiveIDIn);
          local_78.m_data[0] = (pVVar1->position).m_data[0] + -0.01 + local_48;
          local_78.m_data[1] = (pVVar1->position).m_data[1] + 0.08 + fStack_44;
          local_78.m_data[2] = (pVVar1->position).m_data[2] + 0.0 + fStack_40;
          local_78.m_data[3] = (pVVar1->position).m_data[3] + 0.0 + fStack_3c;
          rr::GeometryEmitter::EmitVertex
                    (output,&local_78,pVVar1->pointSize,varyings,pPVar2->primitiveIDIn);
          rr::GeometryEmitter::EndPrimitive(output);
          uVar3 = uVar3 + 1;
        } while (local_60 != uVar3);
      }
      local_88 = local_88 + 1;
      local_58 = local_58 + 7;
    } while (local_88 != local_68);
  }
  return;
}

Assistant:

void VertexExpanderShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(invocationID);

	for (int ndx = 0; ndx < numPackets; ++ndx)
	for (int verticeNdx = 0; verticeNdx < verticesIn; ++verticeNdx)
	{
		const tcu::Vec4 offsets[] =
		{
			tcu::Vec4(-0.07f, -0.01f, 0.0f, 0.0f),
			tcu::Vec4( 0.03f, -0.03f, 0.0f, 0.0f),
			tcu::Vec4(-0.01f,  0.08f, 0.0f, 0.0f)
		};
		const tcu::Vec4 yoffset = float(packets[ndx].primitiveIDIn) * tcu::Vec4(0.02f, 0.1f, 0, 0);

		// Create new primitive at every input vertice
		const rr::VertexPacket* vertex = packets[ndx].vertices[verticeNdx];

		output.EmitVertex(vertex->position + offsets[0] + yoffset, vertex->pointSize, vertex->outputs, packets[ndx].primitiveIDIn);
		output.EmitVertex(vertex->position + offsets[1] + yoffset, vertex->pointSize, vertex->outputs, packets[ndx].primitiveIDIn);
		output.EmitVertex(vertex->position + offsets[2] + yoffset, vertex->pointSize, vertex->outputs, packets[ndx].primitiveIDIn);
		output.EndPrimitive();
	}
}